

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageFilledArc(gdImagePtr im,int cx,int cy,int w,int h,int s,int e,int color,int style)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int y2;
  ulong uVar5;
  int iVar6;
  int y2_00;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  int x2;
  bool bVar13;
  uint local_88;
  gdPoint pts [3];
  
  local_88 = 0x168;
  iVar12 = 0;
  uVar9 = 0;
  if ((uint)((long)s % 0x168) != e % 0x168) {
    uVar9 = (long)s % 0x168 & 0xffffffff;
    if (s < 0x169) {
      uVar9 = (ulong)(uint)s;
    }
    iVar6 = (int)uVar9;
    iVar2 = 0;
    if (0 < iVar6) {
      iVar2 = iVar6;
    }
    iVar8 = (int)(uVar9 >> 0x1f);
    local_88 = e % 0x168;
    if (e < 0x169) {
      local_88 = e;
    }
    uVar7 = ((uint)((iVar2 - iVar6) - iVar8) / 0x168 + iVar8) * 0x168 + iVar6;
    uVar1 = uVar7;
    if ((int)uVar7 < (int)local_88) {
      uVar1 = local_88;
    }
    local_88 = (((uVar1 - local_88) - (uint)((int)local_88 < (int)uVar7)) / 0x168 +
               (uint)((int)local_88 < (int)uVar7)) * 0x168 + local_88;
    bVar13 = uVar7 == local_88;
    if (bVar13) {
      local_88 = 0x168;
    }
    uVar9 = (ulong)uVar7;
    if (bVar13) {
      uVar9 = 0;
    }
  }
  piVar11 = gdCosT + uVar9;
  piVar10 = gdSinT + uVar9;
  y2_00 = 0;
  uVar5 = uVar9;
  iVar2 = 0;
  iVar6 = 0;
  iVar8 = 0;
  for (; (int)uVar9 + iVar12 <= (int)local_88; iVar12 = iVar12 + 1) {
    x2 = (int)(((long)piVar11[(uVar5 / 0x168) * -0x168] * (long)w) / 0x800) + cx;
    y2 = (int)(((long)piVar10[(uVar5 / 0x168) * -0x168] * (long)h) / 0x800) + cy;
    iVar4 = y2_00;
    iVar3 = iVar8;
    if (iVar12 == 0) {
      iVar4 = y2;
      iVar3 = x2;
    }
    if (iVar12 != 0 && (style & 1U) == 0) {
      if ((style & 2U) == 0) {
        pts[0].x = iVar2;
        pts[0].y = iVar6;
        pts[1].x = x2;
        pts[1].y = y2;
        pts[2].x = cx;
        pts[2].y = cy;
        gdImageFilledPolygon(im,pts,3,color);
        iVar3 = iVar8;
        iVar4 = y2_00;
      }
      else {
        gdImageLine(im,iVar2,iVar6,x2,y2,color);
        iVar3 = iVar8;
        iVar4 = y2_00;
      }
    }
    y2_00 = iVar4;
    piVar11 = piVar11 + 1;
    uVar5 = uVar5 + 1;
    piVar10 = piVar10 + 1;
    iVar2 = x2;
    iVar6 = y2;
    iVar8 = iVar3;
  }
  if ((style & 1U) == 0) {
    if ((~style & 6U) != 0) {
      return;
    }
    gdImageLine(im,cx,cy,iVar2,iVar6,color);
    iVar12 = cx;
    iVar4 = cy;
    iVar2 = iVar8;
    iVar6 = y2_00;
  }
  else {
    if ((style & 2U) == 0) {
      pts[0].x = iVar8;
      pts[0].y = y2_00;
      pts[1].x = iVar2;
      pts[1].y = iVar6;
      pts[2].x = cx;
      pts[2].y = cy;
      gdImageFilledPolygon(im,pts,3,color);
      return;
    }
    iVar12 = iVar8;
    iVar4 = y2_00;
    if ((style & 4U) != 0) {
      gdImageLine(im,cx,cy,iVar2,iVar6,color);
      gdImageLine(im,cx,cy,iVar8,y2_00,color);
    }
  }
  gdImageLine(im,iVar12,iVar4,iVar2,iVar6,color);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledArc (gdImagePtr im, int cx, int cy, int w, int h, int s, int e,
									int color, int style)
{
	gdPoint pts[3];
	int i;
	int lx = 0, ly = 0;
	int fx = 0, fy = 0;

	if ((s % 360)  == (e % 360)) {
		s = 0;
		e = 360;
	} else {
		if (s > 360) {
			s = s % 360;
		}

		if (e > 360) {
			e = e % 360;
		}

		while (s < 0) {
			s += 360;
		}

		while (e < s) {
			e += 360;
		}

		if (s == e) {
			s = 0;
			e = 360;
		}
	}

	for (i = s; (i <= e); i++) {
		int x, y;
		x = ((long) gdCosT[i % 360] * (long) w / (2 * 1024)) + cx;
		y = ((long) gdSinT[i % 360] * (long) h / (2 * 1024)) + cy;
		if (i != s) {
			if (!(style & gdChord)) {
				if (style & gdNoFill) {
					gdImageLine (im, lx, ly, x, y, color);
				} else {
					/* This is expensive! */
					pts[0].x = lx;
					pts[0].y = ly;
					pts[1].x = x;
					pts[1].y = y;
					pts[2].x = cx;
					pts[2].y = cy;
					gdImageFilledPolygon (im, pts, 3, color);
				}
			}
		} else {
			fx = x;
			fy = y;
		}
		lx = x;
		ly = y;
	}
	if (style & gdChord) {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
			gdImageLine (im, fx, fy, lx, ly, color);
		} else {
			pts[0].x = fx;
			pts[0].y = fy;
			pts[1].x = lx;
			pts[1].y = ly;
			pts[2].x = cx;
			pts[2].y = cy;
			gdImageFilledPolygon (im, pts, 3, color);
		}
	} else {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
		}
	}
}